

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_channel.c
# Opt level: O0

int ChnlIotDevicePushCmd(uint32_t cmd,char *payload,uint32_t payload_len)

{
  int iVar1;
  int iVar2;
  CommAttribute local_20;
  int ret;
  CommAttribute attr;
  uint32_t payload_len_local;
  char *payload_local;
  uint32_t cmd_local;
  
  local_20.reliable = 1;
  ret = payload_len;
  _attr = payload;
  iVar1 = _is_channel_inited();
  if (iVar1 == 0) {
    iVar1 = LogLevelValid(0);
    if (iVar1 != 0) {
      LogWrite(0,"channel","ChnlIotDevicePushCmd",0x132,"module not init");
    }
    payload_local._4_4_ = -1;
  }
  else {
    iVar1 = CommProtocolPacketAssembleAndSend((CommCmd)cmd,_attr,(CommPayloadLen)ret,&local_20);
    if (iVar1 == 0) {
      payload_local._4_4_ = 0;
    }
    else {
      iVar2 = LogLevelValid(2);
      if (iVar2 != 0) {
        LogWrite(2,"channel","ChnlIotDevicePushCmd",0x13b,"transmit failed. err=%d",iVar1);
      }
      payload_local._4_4_ = -1;
    }
  }
  return payload_local._4_4_;
}

Assistant:

int ChnlIotDevicePushCmd(uint32_t cmd, char *payload, uint32_t payload_len) {
  CommAttribute attr = {1};
  if (!_is_channel_inited()) {
    LOGE(TAG, "module not init");
    return -1;
  }

  int ret = CommProtocolPacketAssembleAndSend(cmd,
                                              payload,
                                              payload_len,
                                              &attr);
  if (ret != 0) {
    LOGT(TAG, "transmit failed. err=%d", ret);
    return -1;
  }
  return 0;
}